

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::read_modify_write
               (bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp __args;
  MicroOp __args_00;
  undefined7 in_register_00000039;
  MicroOp __args_01;
  
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationSetMemoryLock);
  if ((int)CONCAT71(in_register_00000039,is8bit) == 0) {
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementData);
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchData);
    __args_00 = CycleStoreDecrementData;
    __args_01 = OperationPerform;
    __args = CycleStoreOrFetchDataThrowaway;
  }
  else {
    __args_00 = OperationPerform;
    __args_01 = CycleStoreOrFetchDataThrowaway;
    __args = CycleFetchData;
  }
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,__args);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,__args_01);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,__args_00);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleStoreData);
  return;
}

Assistant:

static void read_modify_write(bool is8bit, const std::function<void(MicroOp)> &target) {
		target(OperationSetMemoryLock);					// Set the memory lock output until the end of this instruction.

		if(!is8bit)	target(CycleFetchIncrementData);	// Data low.
		target(CycleFetchData);							// Data [high].

		target(CycleStoreOrFetchDataThrowaway);			// Native mode: reread final byte of data.
														// Emulated mode: rewrite final byte of data.

		target(OperationPerform);						// Perform operation within the data buffer.

		if(!is8bit)	target(CycleStoreDecrementData);	// Data high.
		target(CycleStoreData);							// Data [low].
	}